

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

size_t SSL_CTX_sess_number(SSL_CTX *ctx)

{
  size_t sVar1;
  MutexLockBase<&CRYPTO_MUTEX_lock_read,_&CRYPTO_MUTEX_unlock_read> local_18;
  MutexReadLock lock;
  SSL_CTX *ctx_local;
  
  lock.mu_ = (CRYPTO_MUTEX *)ctx;
  bssl::internal::MutexLockBase<&CRYPTO_MUTEX_lock_read,_&CRYPTO_MUTEX_unlock_read>::MutexLockBase
            (&local_18,&ctx->lock);
  sVar1 = lh_SSL_SESSION_num_items((lhash_st_SSL_SESSION *)lock.mu_[2].__align);
  bssl::internal::MutexLockBase<&CRYPTO_MUTEX_lock_read,_&CRYPTO_MUTEX_unlock_read>::~MutexLockBase
            (&local_18);
  return sVar1;
}

Assistant:

size_t SSL_CTX_sess_number(const SSL_CTX *ctx) {
  MutexReadLock lock(const_cast<CRYPTO_MUTEX *>(&ctx->lock));
  return lh_SSL_SESSION_num_items(ctx->sessions);
}